

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_xmi_midiout.cpp
# Opt level: O0

int __thiscall XMISong::FindXMIDforms(XMISong *this,BYTE *chunk,int len,TrackInfo *songs)

{
  int iVar1;
  uint uVar2;
  int chunklen;
  int chunktype;
  int p;
  int count;
  TrackInfo *songs_local;
  int len_local;
  BYTE *chunk_local;
  XMISong *this_local;
  
  chunktype = 0;
  chunklen = 0;
  while (chunklen <= len + -0xc) {
    iVar1 = GetNativeInt(chunk + chunklen);
    uVar2 = GetBigInt(chunk + (long)chunklen + 4);
    if (iVar1 == 0x4d524f46) {
      iVar1 = GetNativeInt(chunk + (long)chunklen + 8);
      if (iVar1 == 0x44494d58) {
        if (songs != (TrackInfo *)0x0) {
          FoundXMID(this,chunk + (long)chunklen + 0xc,uVar2 - 4,songs + chunktype);
        }
        chunktype = chunktype + 1;
      }
    }
    else if (iVar1 == 0x20544143) {
      iVar1 = FindXMIDforms(this,chunk + (long)chunklen + 0xc,uVar2 - 4,songs + chunktype);
      chunktype = iVar1 + chunktype;
    }
    chunklen = uVar2 + 8 + (uVar2 & 1) + chunklen;
    if ((int)uVar2 < 0) {
      chunklen = len;
    }
  }
  return chunktype;
}

Assistant:

int XMISong::FindXMIDforms(const BYTE *chunk, int len, TrackInfo *songs) const
{
	int count = 0;

	for (int p = 0; p <= len - 12; )
	{
		int chunktype = GetNativeInt(chunk + p);
		int chunklen = GetBigInt(chunk + p + 4);

		if (chunktype == MAKE_ID('F','O','R','M'))
		{
			if (GetNativeInt(chunk + p + 8) == MAKE_ID('X','M','I','D'))
			{
				if (songs != NULL)
				{
					FoundXMID(chunk + p + 12, chunklen - 4, songs + count);
				}
				count++;
			}
		}
		else if (chunktype == MAKE_ID('C','A','T',' '))
		{
			// Recurse to handle CAT chunks.
			count += FindXMIDforms(chunk + p + 12, chunklen - 4, songs + count);
		}
		// IFF chunks are padded to even byte boundaries to avoid
		// unaligned reads on 68k processors.
		p += 8 + chunklen + (chunklen & 1);
		// Avoid crashes from corrupt chunks which indicate a negative size.
		if (chunklen < 0) p = len;
	}
	return count;
}